

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

bool QFontDatabase::bold(QString *family,QString *style)

{
  QtFontFoundry *pQVar1;
  int iVar2;
  Type *mutex;
  QtFontFamily *pQVar3;
  QtFontStyle *pQVar4;
  int j;
  long lVar5;
  int k;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QtFontFoundry allStyles;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  Key local_4c;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  parseFontName(family,(QString *)&local_88,(QString *)&local_68);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                      *)family);
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48,mutex);
  QFontDatabasePrivate::ensureFontDatabase();
  allStyles.styles = (QtFontStyle **)&DAT_aaaaaaaaaaaaaaaa;
  allStyles.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  allStyles._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  allStyles.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  allStyles.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QtFontFoundry::QtFontFoundry(&allStyles,(QString *)&local_88);
  pQVar3 = QFontDatabasePrivate::family
                     (&QFontDatabasePrivate::instance::instance,(QString *)&local_68,EnsurePopulated
                     );
  if (pQVar3 == (QtFontFamily *)0x0) {
    bVar7 = false;
  }
  else {
    for (lVar5 = 0; lVar5 < pQVar3->count; lVar5 = lVar5 + 1) {
      pQVar1 = pQVar3->foundries[lVar5];
      if (local_88.size == 0) {
LAB_00429549:
        for (lVar6 = 0; lVar6 < pQVar1->count; lVar6 = lVar6 + 1) {
          QtFontFoundry::style
                    (&allStyles,&pQVar1->styles[lVar6]->key,&pQVar1->styles[lVar6]->styleName,true);
        }
      }
      else {
        iVar2 = QString::compare((QString *)pQVar1,(CaseSensitivity)&local_88);
        if (iVar2 == 0) goto LAB_00429549;
      }
    }
    local_4c = (Key)0xaaaaaaaa;
    QtFontStyle::Key::Key(&local_4c,style);
    bVar7 = false;
    pQVar4 = QtFontFoundry::style(&allStyles,&local_4c,style,false);
    if (pQVar4 != (QtFontStyle *)0x0) {
      bVar7 = 0xaec < (*(ushort *)&pQVar4->key & 0xff0);
    }
  }
  QtFontFoundry::~QtFontFoundry(&allStyles);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDatabase::bold(const QString &family,
                          const QString &style)
{
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QtFontFoundry allStyles(foundryName);
    QtFontFamily *f = d->family(familyName);
    if (!f) return false;

    for (int j = 0; j < f->count; j++) {
        QtFontFoundry *foundry = f->foundries[j];
        if (foundryName.isEmpty() ||
            foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            for (int k = 0; k < foundry->count; k++)
                allStyles.style(foundry->styles[k]->key, foundry->styles[k]->styleName, true);
        }
    }

    QtFontStyle::Key styleKey(style);
    QtFontStyle *s = allStyles.style(styleKey, style);
    return s && s->key.weight >= QFont::Bold;
}